

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Chapters::Edition::ExpandAtomsArray(Edition *this)

{
  int iVar1;
  uint uVar2;
  Atom *pAVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ulong *puVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  iVar1 = this->m_atoms_size;
  uVar2 = this->m_atoms_count;
  bVar5 = true;
  if (iVar1 <= (int)uVar2) {
    iVar8 = 1;
    if (iVar1 != 0) {
      iVar8 = iVar1 * 2;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)iVar8;
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
      uVar7 = SUB168(auVar4 * ZEXT816(0x30),0) | 8;
    }
    puVar6 = (ulong *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    uVar7 = 0;
    if (puVar6 == (ulong *)0x0) {
      bVar5 = false;
    }
    else {
      *puVar6 = (long)iVar8;
      pAVar3 = this->m_atoms;
      uVar9 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar9 = uVar7;
      }
      for (; uVar9 * 0x30 - uVar7 != 0; uVar7 = uVar7 + 0x30) {
        Atom::ShallowCopy((Atom *)((long)&pAVar3->m_string_uid + uVar7),
                          (Atom *)((long)&((Atom *)(puVar6 + 1))->m_string_uid + uVar7));
      }
      if (pAVar3 != (Atom *)0x0) {
        operator_delete__(&pAVar3[-1].m_displays_size);
      }
      this->m_atoms = (Atom *)(puVar6 + 1);
      this->m_atoms_size = iVar8;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool Chapters::Edition::ExpandAtomsArray() {
  if (m_atoms_size > m_atoms_count)
    return true;  // nothing else to do

  const int size = (m_atoms_size == 0) ? 1 : 2 * m_atoms_size;

  Atom* const atoms = new (std::nothrow) Atom[size];

  if (atoms == NULL)
    return false;

  for (int idx = 0; idx < m_atoms_count; ++idx) {
    m_atoms[idx].ShallowCopy(atoms[idx]);
  }

  delete[] m_atoms;
  m_atoms = atoms;

  m_atoms_size = size;
  return true;
}